

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

double __thiscall pstore::broker::command_processor::log(command_processor *this,double __x)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  not_null<const_char_*> nVar5;
  long *plVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar8;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  double dVar9;
  undefined4 extraout_XMM0_Db;
  string message;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  not_null<const_char_*> local_30;
  
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::reserve((ulong)&local_50);
  std::operator+(&local_70,"verb:",in_RSI);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar1 = in_RSI[1]._M_string_length;
  if (uVar1 < 0x20) {
    pcVar2 = in_RSI[1]._M_dataplus._M_p;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar2,pcVar2 + uVar1);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)(in_RSI + 1));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_80 = *plVar7;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
      local_90 = (long *)*plVar6;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((0x1f < uVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_30.ptr_ = local_50;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_30);
  nVar5.ptr_ = local_30.ptr_;
  dVar9 = (double)pstore::details::log_destinations::__tls_init();
  lVar3 = *in_FS_OFFSET;
  if (*(long *)(lVar3 + -8) != 0) {
    dVar9 = (double)pstore::details::log_destinations::__tls_init();
    puVar8 = *(undefined8 **)(lVar3 + -8);
    puVar4 = (undefined8 *)puVar8[1];
    for (puVar8 = (undefined8 *)*puVar8; puVar8 != puVar4; puVar8 = puVar8 + 1) {
      dVar9 = (double)(**(code **)(*(long *)*puVar8 + 0x48))((long *)*puVar8,6,nVar5.ptr_);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    dVar9 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  return dVar9;
}

Assistant:

void command_processor::log (broker_command const & c) const {
            static constexpr char const verb[] = "verb:";
            static constexpr auto verb_length = array_elements (verb) - 1;
            static constexpr char const path[] = " path:";
            static constexpr auto path_length = array_elements (path) - 1;
            static constexpr auto max_path_length = std::size_t{32};
            static constexpr char const ellipsis[] = "...";
            static constexpr auto ellipsis_length = array_elements (ellipsis) - 1;

            std::string message;
            message.reserve (verb_length + c.verb.length () + path_length + max_path_length +
                             ellipsis_length);

            message = verb + c.verb + path;
            message += (c.path.length () < max_path_length)
                           ? c.path
                           : (c.path.substr (0, max_path_length) + ellipsis);
            pstore::log (priority::info, message.c_str ());
        }